

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall
cmCTestHG::IdentifyParser::IdentifyParser
          (IdentifyParser *this,cmCTestHG *hg,char *prefix,string *rev)

{
  string *rev_local;
  char *prefix_local;
  cmCTestHG *hg_local;
  IdentifyParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_011018e8;
  this->Rev = rev;
  cmsys::RegularExpression::RegularExpression(&this->RegexIdentify);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(hg->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexIdentify,"^([0-9a-f]+)");
  return;
}

Assistant:

IdentifyParser(cmCTestHG* hg, const char* prefix, std::string& rev)
    : Rev(rev)
  {
    this->SetLog(&hg->Log, prefix);
    this->RegexIdentify.compile("^([0-9a-f]+)");
  }